

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2UngreedyUTF8(void)

{
  bool bVar1;
  ostream *poVar2;
  string *__lhs;
  LogMessage local_c08;
  StringPiece local_a88;
  LogMessage local_a78;
  StringPiece local_8f8;
  undefined1 local_8e8 [8];
  RE2 match_sentence_re_1;
  Options local_688;
  StringPiece local_670;
  undefined1 local_660 [8];
  RE2 match_sentence_1;
  string local_578 [8];
  string target_1;
  char *pattern_1;
  StringPiece local_3d0;
  LogMessage local_3c0;
  StringPiece local_240;
  undefined1 local_230 [8];
  RE2 match_sentence_re;
  StringPiece local_138;
  undefined1 local_128 [8];
  RE2 match_sentence;
  allocator local_31;
  string local_30 [8];
  string target;
  char *pattern;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"a aX",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  StringPiece::StringPiece(&local_138,"\\w+X");
  RE2::Options::Options((Options *)&match_sentence_re.named_groups_once_,Latin1);
  RE2::RE2((RE2 *)local_128,&local_138,(Options *)&match_sentence_re.named_groups_once_);
  RE2::RE2((RE2 *)local_230,"\\w+X");
  StringPiece::StringPiece(&local_240,(string *)local_30);
  bVar1 = RE2::FullMatch<>(&local_240,(RE2 *)local_128);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_3c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x461);
    poVar2 = LogMessage::stream(&local_3c0);
    std::operator<<(poVar2,"Check failed: !RE2::FullMatch(target, match_sentence)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3c0);
  }
  StringPiece::StringPiece(&local_3d0,(string *)local_30);
  bVar1 = RE2::FullMatch<>(&local_3d0,(RE2 *)local_230);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&pattern_1,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x462);
    poVar2 = LogMessage::stream((LogMessage *)&pattern_1);
    std::operator<<(poVar2,"Check failed: !RE2::FullMatch(target, match_sentence_re)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&pattern_1);
  }
  RE2::~RE2((RE2 *)local_230);
  RE2::~RE2((RE2 *)local_128);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_578,"a aX",(allocator *)((long)&match_sentence_1.group_names_once_._M_once + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&match_sentence_1.group_names_once_._M_once + 3));
  StringPiece::StringPiece(&local_670,"(?U)\\w+X");
  RE2::Options::Options(&local_688,Latin1);
  RE2::RE2((RE2 *)local_660,&local_670,&local_688);
  __lhs = RE2::error_abi_cxx11_((RE2 *)local_660);
  bVar1 = std::operator==(__lhs,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&match_sentence_re_1.named_groups_once_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x468);
    poVar2 = LogMessage::stream((LogMessage *)&match_sentence_re_1.named_groups_once_);
    std::operator<<(poVar2,"Check failed: (match_sentence.error()) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&match_sentence_re_1.named_groups_once_);
  }
  RE2::RE2((RE2 *)local_8e8,"(?U)\\w+X");
  StringPiece::StringPiece(&local_8f8,(string *)local_578);
  bVar1 = RE2::FullMatch<>(&local_8f8,(RE2 *)local_660);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a78,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x46b);
    poVar2 = LogMessage::stream(&local_a78);
    std::operator<<(poVar2,"Check failed: !RE2::FullMatch(target, match_sentence)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a78);
  }
  StringPiece::StringPiece(&local_a88,(string *)local_578);
  bVar1 = RE2::FullMatch<>(&local_a88,(RE2 *)local_8e8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c08,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x46c);
    poVar2 = LogMessage::stream(&local_c08);
    std::operator<<(poVar2,"Check failed: !RE2::FullMatch(target, match_sentence_re)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c08);
  }
  RE2::~RE2((RE2 *)local_8e8);
  RE2::~RE2((RE2 *)local_660);
  std::__cxx11::string::~string(local_578);
  return;
}

Assistant:

TEST(RE2, UngreedyUTF8) {
  // Check that ungreedy, UTF8 regular expressions don't match when they
  // oughtn't -- see bug 82246.
  {
    // This code always worked.
    const char* pattern = "\\w+X";
    const string target = "a aX";
    RE2 match_sentence(pattern, RE2::Latin1);
    RE2 match_sentence_re(pattern);

    CHECK(!RE2::FullMatch(target, match_sentence));
    CHECK(!RE2::FullMatch(target, match_sentence_re));
  }
  {
    const char* pattern = "(?U)\\w+X";
    const string target = "a aX";
    RE2 match_sentence(pattern, RE2::Latin1);
    CHECK_EQ(match_sentence.error(), "");
    RE2 match_sentence_re(pattern);

    CHECK(!RE2::FullMatch(target, match_sentence));
    CHECK(!RE2::FullMatch(target, match_sentence_re));
  }
}